

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

void __thiscall picojson::value::value(value *this,value *x)

{
  int iVar1;
  array *paVar2;
  pointer pvVar3;
  string *this_00;
  
  iVar1 = x->type_;
  this->type_ = iVar1;
  if (iVar1 == 5) {
    this_00 = (string *)operator_new(0x30);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                *)this_00,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_picojson::value>_>_>
                *)(x->u_).string_);
  }
  else if (iVar1 == 4) {
    this_00 = (string *)operator_new(0x18);
    std::vector<picojson::value,_std::allocator<picojson::value>_>::vector
              ((vector<picojson::value,_std::allocator<picojson::value>_> *)this_00,
               (vector<picojson::value,_std::allocator<picojson::value>_> *)(x->u_).string_);
  }
  else {
    if (iVar1 != 3) {
      this->u_ = x->u_;
      return;
    }
    this_00 = (string *)operator_new(0x20);
    paVar2 = (x->u_).array_;
    (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
    pvVar3 = (paVar2->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl
             .super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)this_00,pvVar3,
               (long)&((paVar2->
                       super__Vector_base<picojson::value,_std::allocator<picojson::value>_>).
                       _M_impl.super__Vector_impl_data._M_finish)->type_ + (long)pvVar3);
  }
  (this->u_).string_ = this_00;
  return;
}

Assistant:

inline value::value(const value& x) : type_(x.type_) {
    switch (type_) {
#define INIT(p, v) case p##type: u_.p = v; break
      INIT(string_, new std::string(*x.u_.string_));
      INIT(array_, new array(*x.u_.array_));
      INIT(object_, new object(*x.u_.object_));
#undef INIT
    default:
      u_ = x.u_;
      break;
    }
  }